

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entity.cpp
# Opt level: O2

void __thiscall
Entity::Entity(Entity *this,uint8_t type_id,uint8_t pos_x,uint8_t pos_y,uint8_t pos_z)

{
  Attributes local_60;
  
  local_60.position.half_x = false;
  local_60.position.half_y = false;
  local_60.position.half_z = false;
  local_60.orientation = '\0';
  local_60.palette = '\x01';
  local_60.behavior_id = 0;
  local_60.speed = '\0';
  local_60.fightable = false;
  local_60.liftable = false;
  local_60.can_pass_through = false;
  local_60.appear_after_player_moved_away = false;
  local_60.gravity_immune = false;
  local_60.talkable = false;
  local_60.dialogue = '\0';
  local_60.entity_to_use_tiles_from = (Entity *)0x0;
  local_60.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_60.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_60.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_60.persistence_flag._vptr_Flag = (_func_int **)&PTR_to_json_abi_cxx11__002468a8;
  local_60.persistence_flag.byte = 0xff;
  local_60.persistence_flag.bit = 0xff;
  local_60.flag_unknown_2_3 = false;
  local_60.flag_unknown_2_4 = false;
  local_60.flag_unknown_3_5 = false;
  local_60.type_id = type_id;
  local_60.position.x = pos_x;
  local_60.position.y = pos_y;
  local_60.position.z = pos_z;
  Entity(this,&local_60);
  std::_Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>::~_Vector_base
            (&local_60.mask_flags.
              super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>);
  return;
}

Assistant:

Entity::Entity(uint8_t type_id, uint8_t pos_x, uint8_t pos_y, uint8_t pos_z) :
    Entity({ 
        .type_id = type_id,
        .position = Position(pos_x, pos_y, pos_z)
    })
{}